

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_csv2xlsx.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  char local_199;
  int toprow;
  char lastchar;
  size_t unquoted;
  size_t valuelen;
  char *value;
  size_t bufpos;
  size_t bufstart;
  size_t buflen;
  char buf [256];
  uchar bom [3];
  int i_1;
  char *p;
  size_t xlsxdetectionrows;
  char *filename;
  char *sheetname;
  xlsxiowriter xlsxiowrite;
  int toprowheaders;
  char quote;
  char separator;
  FILE *src;
  char *param;
  int i;
  char **argv_local;
  int argc_local;
  
  xlsxiowrite._7_1_ = ',';
  bVar3 = false;
  p = (char *)0x14;
  if (argc == 1) {
    show_help();
  }
  else {
    for (param._4_4_ = 1; param._4_4_ < argc; param._4_4_ = param._4_4_ + 1) {
      if ((*argv[param._4_4_] == '\0') ||
         ((*argv[param._4_4_] != '/' && (*argv[param._4_4_] != '-')))) {
LAB_001015ad:
        filename = (char *)0x0;
        xlsxdetectionrows = 0;
        iVar4 = strcmp(argv[param._4_4_],"-");
        if (iVar4 == 0) {
          _toprowheaders = _stdin;
          filename = strdup("Sheet1");
          xlsxdetectionrows = (size_t)strdup("data.xlsx");
        }
        else {
          _toprowheaders = fopen(argv[param._4_4_],"rb");
          if (_toprowheaders == (FILE *)0x0) {
            fprintf(_stderr,"Error opening file: %s\n",argv[param._4_4_]);
          }
          else {
            filename = strdup(argv[param._4_4_]);
            if (filename != (char *)0x0) {
              pcVar5 = strrchr(filename,0x2e);
              if (pcVar5 != (char *)0x0) {
                *pcVar5 = '\0';
              }
              sVar7 = strlen(filename);
              buf._252_4_ = (int)sVar7;
              do {
                iVar4 = buf._252_4_ + -1;
                bVar1 = (int)buf._252_4_ < 1;
                buf._252_4_ = iVar4;
                if (bVar1) goto LAB_00101718;
              } while (filename[iVar4] != '/');
              sVar7 = strlen(filename);
              memmove(filename,filename + (long)iVar4 + 1,sVar7 - (long)(int)buf._252_4_);
            }
LAB_00101718:
            sVar7 = strlen(argv[param._4_4_]);
            xlsxdetectionrows = (size_t)malloc(sVar7 + 6);
            if ((char *)xlsxdetectionrows == (char *)0x0) {
              fprintf(_stderr,"Memory allocation error\n");
            }
            else {
              strcpy((char *)xlsxdetectionrows,argv[param._4_4_]);
              strcat((char *)xlsxdetectionrows,".xlsx");
            }
          }
        }
        if (((_toprowheaders != (FILE *)0x0) && (xlsxdetectionrows != 0)) &&
           (filename != (char *)0x0)) {
          lVar6 = xlsxiowrite_open(xlsxdetectionrows,filename);
          if (lVar6 != 0) {
            xlsxiowrite_set_detection_rows(lVar6,p);
            xlsxiowrite_set_row_height(lVar6,1);
            sVar7 = fread(buf + 0xf9,1,3,_toprowheaders);
            if (((sVar7 != 3) || (buf[0xf9] != -0x11)) ||
               ((buf[0xfa] != -0x45 || (buf[0xfb] != -0x41)))) {
              fseek(_toprowheaders,0,0);
            }
            bufstart = 0;
            valuelen = 0;
            unquoted = 0;
            bVar1 = true;
            local_199 = '\0';
            bVar2 = true;
            while( true ) {
              bufpos = 0;
              value = (char *)0x0;
              bufstart = fread(&buflen,1,0x100,_toprowheaders);
              if (bufstart == 0) break;
              for (; value < bufstart; value = value + 1) {
                if (bVar1) {
                  if ((*(char *)((long)&buflen + (long)value) == xlsxiowrite._7_1_) ||
                     (*(char *)((long)&buflen + (long)value) == '\n')) {
                    append_buffer_data((char **)&valuelen,&unquoted,buf + (bufpos - 8),
                                       (long)value - bufpos);
                    bufpos = (size_t)(value + 1);
                    if ((*(char *)((long)&buflen + (long)value) == '\n') &&
                       ((unquoted != 0 && (*(char *)(valuelen + (unquoted - 1)) == '\r')))) {
                      unquoted = unquoted - 1;
                    }
                    if (valuelen != 0) {
                      *(undefined1 *)(valuelen + unquoted) = 0;
                    }
                    if ((bVar2) && (bVar3)) {
                      xlsxiowrite_add_column(lVar6,valuelen,0);
                    }
                    else {
                      xlsxiowrite_add_cell_string(lVar6,valuelen);
                    }
                    free((void *)valuelen);
                    valuelen = 0;
                    unquoted = 0;
                    if (*(char *)((long)&buflen + (long)value) == '\n') {
                      xlsxiowrite_next_row(lVar6);
                      bVar2 = false;
                    }
                  }
                  else if (*(char *)((long)&buflen + (long)value) == '\"') {
                    append_buffer_data((char **)&valuelen,&unquoted,buf + (bufpos - 8),
                                       (size_t)(value + ((long)(int)(uint)(local_199 == '\"') -
                                                        bufpos)));
                    bufpos = (size_t)(value + 1);
                    bVar1 = false;
                  }
                }
                else if (*(char *)((long)&buflen + (long)value) == '\"') {
                  append_buffer_data((char **)&valuelen,&unquoted,buf + (bufpos - 8),
                                     (long)value - bufpos);
                  bufpos = (size_t)(value + 1);
                  bVar1 = true;
                }
                local_199 = *(char *)((long)&buflen + (long)value);
              }
              append_buffer_data((char **)&valuelen,&unquoted,buf + (bufpos - 8),
                                 (long)value - bufpos);
            }
            xlsxiowrite_close(lVar6);
            free((void *)valuelen);
          }
          fclose(_toprowheaders);
        }
        free((void *)xlsxdetectionrows);
        free(filename);
      }
      else {
        iVar4 = tolower((int)argv[param._4_4_][1]);
        if (iVar4 == 0x3f) {
LAB_00101481:
          show_help();
          return 0;
        }
        if (iVar4 == 100) {
          if (argv[param._4_4_][2] == '\0') {
            if ((param._4_4_ + 1 < argc) && (argv[param._4_4_ + 1] != (char *)0x0)) {
              param._4_4_ = param._4_4_ + 1;
              src = (FILE *)argv[param._4_4_];
            }
            else {
              src = (FILE *)0x0;
            }
          }
          else {
            src = (FILE *)(argv[param._4_4_] + 2);
          }
          if (src != (FILE *)0x0) {
            p = (char *)strtol((char *)src,(char **)0x0,10);
          }
        }
        else {
          if (iVar4 == 0x68) goto LAB_00101481;
          if (iVar4 == 0x73) {
            if (argv[param._4_4_][2] == '\0') {
              if ((param._4_4_ + 1 < argc) && (argv[param._4_4_ + 1] != (char *)0x0)) {
                param._4_4_ = param._4_4_ + 1;
                src = (FILE *)argv[param._4_4_];
              }
              else {
                src = (FILE *)0x0;
              }
            }
            else {
              src = (FILE *)(argv[param._4_4_] + 2);
            }
            if (src != (FILE *)0x0) {
              xlsxiowrite._7_1_ = (char)src->_flags;
            }
          }
          else {
            if (iVar4 != 0x74) goto LAB_001015ad;
            bVar3 = true;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int main (int argc, char* argv[])
{
  int i;
  char* param;
  FILE* src;
  char separator = ',';
  char quote = '"';
  int toprowheaders = 0;
  xlsxiowriter xlsxiowrite;
  char* sheetname;
  char* filename;
  size_t xlsxdetectionrows = DEFAULT_DETECTION_ROWS;
  //process command line parameters
  if (argc == 1) {
    show_help();
    return 0;
  }
  for (i = 1; i < argc; i++) {
    //check for command line parameters
    if (argv[i][0] && (argv[i][0] == '/' || argv[i][0] == '-')) {
      switch (tolower(argv[i][1])) {
        case 'h' :
        case '?' :
          show_help();
          return 0;
        case 's' :
          if (argv[i][2])
            param = argv[i] + 2;
          else if (i + 1 < argc && argv[i + 1])
            param = argv[++i];
          else
            param = NULL;
          if (param)
            separator = param[0];
          continue;
        case 'd' :
          if (argv[i][2])
            param = argv[i] + 2;
          else if (i + 1 < argc && argv[i + 1])
            param = argv[++i];
          else
            param = NULL;
          if (param)
            xlsxdetectionrows = strtol(param, (char**)NULL, 10);
          continue;
        case 't' :
          toprowheaders = 1;
          continue;
      }
    }
    //open CSV file
    sheetname = NULL;
    filename = NULL;
    src = NULL;
    if (strcmp(argv[i], "-") == 0) {
      src = stdin;
#ifdef _WIN32
      setmode(fileno(stdin), O_BINARY);
#endif
      sheetname = strdup("Sheet1");
      filename = strdup("data.xlsx");
    } else if ((src = fopen(argv[i], "rb")) == NULL) {
      fprintf(stderr, "Error opening file: %s\n", argv[i]);
    } else {
      //determine sheetname
      if ((sheetname = strdup(argv[i])) != NULL) {
        char* p;
        int i;
        //strip extension
        if ((p = strrchr(sheetname, '.')) != NULL)
          *p = 0;
        //strip path
        i = strlen(sheetname);
        while (i-- > 0) {
          if (sheetname[i] == '/'
#ifdef _WIN32
            || sheetname[i] == '\\'
#endif
          ) {
            memmove(sheetname, sheetname + i + 1, strlen(sheetname) - i);
            break;
          }
        }
      }
      //determine output filename
      if ((filename = (char*)malloc(strlen(argv[i]) + 6)) == NULL ){
        fprintf(stderr, "Memory allocation error\n");
      } else {
        strcpy(filename, argv[i]);
        strcat(filename, ".xlsx");
      }
    }
    if (src && filename && sheetname) {
      //create .xslx file
      if ((xlsxiowrite = xlsxiowrite_open(filename, sheetname)) != NULL) {
        xlsxiowrite_set_detection_rows(xlsxiowrite, xlsxdetectionrows);
        xlsxiowrite_set_row_height(xlsxiowrite, 1);
        //skip UTF-8 BOM header if present
        unsigned char bom[3];
        if (!(fread(bom, 1, 3, src) == 3 && bom[0] == 0xEF && bom[1] == 0xBB && bom[2] == 0xBF)) {
          fseek(src, 0, SEEK_SET);
        }
        //process CSV file
        char buf[BUFFER_SIZE];
        size_t buflen = 0;
        size_t bufstart = 0;
        size_t bufpos = 0;
        char* value = NULL;
        size_t valuelen = 0;
        size_t unquoted = 1;
        char lastchar = 0;
        int toprow = 1;
        //read data one buffer at a tome
        while ((buflen = fread(buf, 1, BUFFER_SIZE, src)) > 0) {
          //process each character in buffer
          while (bufpos < buflen) {
            if (unquoted) {
              if (buf[bufpos] == separator || buf[bufpos] == '\n') {
                //process end of cell
                append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart);
                bufstart = bufpos + 1;
                //detect CRLF line breaks and skip CR
                if (buf[bufpos] == '\n' && valuelen > 0 && value[valuelen - 1] == '\r')
                  valuelen--;
                //write cell value
                if (value)
                  value[valuelen] = 0;
                if (toprow && toprowheaders)
                  xlsxiowrite_add_column(xlsxiowrite, value, 0);
                else
                  xlsxiowrite_add_cell_string(xlsxiowrite, value);
                //clean up cell value
                free(value);
                value = NULL;
                valuelen = 0;
                //process end of line
                if (buf[bufpos] == '\n') {
                  xlsxiowrite_next_row(xlsxiowrite);
                  toprow = 0;
                }
              } else if (buf[bufpos] == quote) {
                //process upen quote
                append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart + (lastchar == quote ? 1 : 0));
                bufstart = bufpos + 1;
                unquoted = 0;
              }
            } else if (buf[bufpos] == quote) {
              //process close quote
              append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart);
              bufstart = bufpos + 1;
              unquoted = 1;
            }
            //prepare for processing next character
            lastchar = buf[bufpos];
            bufpos++;
          }
          //dump data at end of buffer and reset counters
          append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart);
          bufstart = 0;
          bufpos = 0;
        }
        //close .xlsx file
        xlsxiowrite_close(xlsxiowrite);
        //clean up
        free(value);
      }
      //close CSV file
      fclose(src);
    }
    //clean up
    free(filename);
    free(sheetname);
  }
  return 0;
}